

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.h
# Opt level: O2

void __thiscall TypeMemberSet::TypeMemberSet(TypeMemberSet *this,InplaceStr name,TypeStruct *type)

{
  TypeBase::TypeBase(&this->super_TypeBase,0x1c,name);
  (this->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__TypeBase_00223e10;
  this->type = type;
  (this->super_TypeBase).isGeneric = true;
  return;
}

Assistant:

TypeMemberSet(InplaceStr name, TypeStruct *type): TypeBase(myTypeID, name), type(type)
	{
		isGeneric = true;
	}